

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-copy-mpi.c
# Opt level: O2

void server(void)

{
  size_t sVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined4 local_68;
  int local_64;
  MPI_Status status;
  ulong local_48;
  int64_t work [2];
  int result;
  
  sVar1 = buffersize;
  lVar4 = (long)bb.nmemb;
  iVar2 = big_file_dtype_itemsize(bb.dtype);
  uVar5 = 0;
  uVar3 = sVar1 / (ulong)(iVar2 * lVar4);
  while (uVar5 < bb.size) {
    work[1]._4_4_ = 0;
    MPI_Recv((long)work + 0xc,1,&ompi_mpi_int,0xffffffff,0xffffffff,&ompi_mpi_comm_world,&local_68);
    if (local_64 == 0x50f) break;
    if (bb.size < uVar5 + uVar3) {
      uVar3 = bb.size - uVar5;
    }
    local_48 = uVar5;
    work[0] = uVar3;
    MPI_Send(&local_48,1,MPI_TYPE_WORK,local_68,0x50b,&ompi_mpi_comm_world);
    uVar5 = uVar5 + uVar3;
    if (verbose != 0) {
      auVar6._8_4_ = (int)(bb.size >> 0x20);
      auVar6._0_8_ = bb.size;
      auVar6._12_4_ = 0x45300000;
      fprintf(_stderr,"%ld / %td done (%0.4g%%)\r",
              (double)(long)uVar5 *
              (100.0 / ((auVar6._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)bb.size) - 4503599627370496.0))),uVar5);
    }
  }
  for (iVar2 = 1; iVar2 < NTask; iVar2 = iVar2 + 1) {
    MPI_Send(&local_68,1,MPI_TYPE_WORK,iVar2,0x50a,&ompi_mpi_comm_world);
  }
  return;
}

Assistant:

void server() {
    int64_t chunksize = buffersize / (bb.nmemb * dtype_itemsize(bb.dtype));
    int64_t offset;
    int64_t work[2];
    for(offset = 0; offset < bb.size; ) {
        MPI_Status status;
        int result = 0;
        MPI_Recv(&result, 1, MPI_INT, MPI_ANY_SOURCE, MPI_ANY_TAG, MPI_COMM_WORLD,
                &status);
        if(status.MPI_TAG == ERROR_TAG) {
            break;
        }

        /* never read beyond my end (read_simple caps at EOF) */
        if(offset + chunksize > bb.size) {
            chunksize = bb.size - offset;
        }
        work[0] = offset;
        work[1] = chunksize;
        MPI_Send(work, 1, MPI_TYPE_WORK, status.MPI_SOURCE, WORK_TAG, MPI_COMM_WORLD);

        offset += chunksize;
        if(verbose) {
            fprintf(stderr, "%ld / %td done (%0.4g%%)\r", offset, bb.size, (100. / bb.size) * offset);
        }
    }
    int i;
    for(i = 1; i < NTask; i ++) {
        int64_t work[2];
        MPI_Send(work, 1, MPI_TYPE_WORK, i, DIE_TAG, MPI_COMM_WORLD);
    }

}